

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments
          (sysbvm_context_t *context,sysbvm_tuple_t function,size_t argumentCount,
          sysbvm_tuple_t *arguments,sysbvm_bitflags_t applicationFlags)

{
  _Bool _Var1;
  size_t argumentCount_00;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  ulong local_68;
  size_t i;
  sysbvm_tuple_t *variadicVectorElements;
  sysbvm_tuple_t variadicVector;
  size_t variadicArgumentCount;
  size_t directArgumentCount;
  size_t expectedArgumentCount;
  sysbvm_bitflags_t applicationFlags_local;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t function_local;
  sysbvm_context_t *context_local;
  
  if (((applicationFlags & 3) == 0) && (_Var1 = sysbvm_function_isVariadic(context,function), _Var1)
     ) {
    argumentCount_00 = sysbvm_function_getArgumentCount(context,function);
    if (argumentCount_00 == 0) {
      sysbvm_error_assertionFailure
                (
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecode.c:102: assertion failure: expectedArgumentCount > 0"
                );
    }
    uVar2 = argumentCount_00 - 1;
    if (argumentCount < uVar2) {
      sysbvm_error("Missing required arguments.");
    }
    sVar3 = sysbvm_array_create(context,argumentCount - uVar2);
    for (local_68 = 0; local_68 < argumentCount - uVar2; local_68 = local_68 + 1) {
      *(sysbvm_tuple_t *)(sVar3 + 0x10 + local_68 * 8) = arguments[uVar2 + local_68];
    }
    arguments[uVar2] = sVar3;
    context_local =
         (sysbvm_context_t *)
         sysbvm_function_apply(context,function,argumentCount_00,arguments,applicationFlags);
  }
  else {
    context_local =
         (sysbvm_context_t *)
         sysbvm_function_apply(context,function,argumentCount,arguments,applicationFlags);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments(sysbvm_context_t *context, sysbvm_tuple_t function, size_t argumentCount, sysbvm_tuple_t *arguments, sysbvm_bitflags_t applicationFlags)
{
    if((applicationFlags & (SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK | SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED)) == 0 &&
        sysbvm_function_isVariadic(context, function))
    {
        size_t expectedArgumentCount = sysbvm_function_getArgumentCount(context, function);
        SYSBVM_ASSERT(expectedArgumentCount > 0);

        // Move the variadic arguments into a variadic vector.
        {
            size_t directArgumentCount = expectedArgumentCount - 1;
            if(argumentCount < directArgumentCount)
                sysbvm_error("Missing required arguments.");

            size_t variadicArgumentCount = argumentCount - directArgumentCount;
            sysbvm_tuple_t variadicVector = sysbvm_array_create(context, variadicArgumentCount);
            sysbvm_tuple_t *variadicVectorElements = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(variadicVector)->pointers;
            for(size_t i = 0; i < variadicArgumentCount; ++i)
                variadicVectorElements[i] = arguments[directArgumentCount + i];
            arguments[directArgumentCount] = variadicVector;
        }

        return sysbvm_function_apply(context, function, expectedArgumentCount, arguments, applicationFlags);

    }
    return sysbvm_function_apply(context, function, argumentCount, arguments, applicationFlags);
}